

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O3

void tchecker::ts::final<tchecker::ta::ta_t>
               (ta_t *bwd_impl,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels
               ,vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
                *v,state_status_t mask)

{
  bool bVar1;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  __begin0;
  final_range_t final_edges;
  tuple<tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
  tStack_398;
  undefined1 local_378 [128];
  final_iterator_t local_2f8 [2];
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  local_1d8;
  
  ta::final_edges((final_range_t *)&local_1d8,
                  (bwd_impl->_system).
                  super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,labels);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_378,&local_1d8);
  while( true ) {
    bVar1 = syncprod::final_iterator_t::operator==(local_2f8,(end_iterator_t *)(local_378 + 0x78));
    if (bVar1) break;
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator*(&tStack_398,
                (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                 *)local_378);
    ta::ta_t::final(bwd_impl,&tStack_398,v,mask);
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator++((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                  *)local_378);
  }
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_378);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t(&local_1d8);
  return;
}

Assistant:

void final(BWD_IMPL & bwd_impl, boost::dynamic_bitset<> const & labels, std::vector<typename BWD_IMPL::sst_t> & v,
           tchecker::state_status_t mask)
{
  typename BWD_IMPL::final_range_t final_edges = bwd_impl.final_edges(labels);
  for (typename BWD_IMPL::final_value_t && final_edge : final_edges)
    bwd_impl.final(final_edge, v, mask);
}